

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

type __thiscall duckdb::Serializer::WriteValue<duckdb::SetScope>(Serializer *this,SetScope value)

{
  char *pcVar1;
  undefined8 extraout_RDX;
  
  if ((this->options).serialize_enum_as_string == true) {
    pcVar1 = EnumUtil::ToChars<duckdb::SetScope>(value);
    (*this->_vptr_Serializer[0x1d])(this,pcVar1,extraout_RDX,this->_vptr_Serializer[0x1d]);
    return;
  }
  (*this->_vptr_Serializer[0xf])(this,value);
  return;
}

Assistant:

typename std::enable_if<std::is_enum<T>::value, void>::type WriteValue(const T value) {
		if (options.serialize_enum_as_string) {
			// Use the enum serializer to lookup tostring function
			auto str = EnumUtil::ToChars(value);
			WriteValue(str);
		} else {
			// Use the underlying type
			WriteValue(static_cast<typename std::underlying_type<T>::type>(value));
		}
	}